

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

CURLcode check_telnet_options(connectdata *conn)

{
  Curl_easy *data_00;
  void *pvVar1;
  int iVar2;
  curl_slist *pcVar3;
  CURLcode local_1bc;
  int binary_option;
  CURLcode result;
  TELNET *tn;
  Curl_easy *data;
  char option_arg [256];
  char option_keyword [128];
  curl_slist *beg;
  curl_slist *head;
  connectdata *conn_local;
  
  memset(option_arg + 0xf8,0,0x80);
  memset(&data,0,0x100);
  data_00 = conn->data;
  pvVar1 = (conn->data->req).protop;
  local_1bc = CURLE_OK;
  if (((conn->bits).user_passwd & 1U) != 0) {
    curl_msnprintf((char *)&data,0x100,"USER,%s",conn->user);
    pcVar3 = curl_slist_append(*(curl_slist **)((long)pvVar1 + 0x1cb0),(char *)&data);
    if (pcVar3 == (curl_slist *)0x0) {
      curl_slist_free_all(*(curl_slist **)((long)pvVar1 + 0x1cb0));
      *(undefined8 *)((long)pvVar1 + 0x1cb0) = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    *(curl_slist **)((long)pvVar1 + 0x1cb0) = pcVar3;
    *(undefined4 *)((long)pvVar1 + 0x8a4) = 1;
  }
  beg = (data_00->set).telnet_options;
  do {
    if (beg == (curl_slist *)0x0) {
LAB_0013e5dd:
      if (local_1bc != CURLE_OK) {
        curl_slist_free_all(*(curl_slist **)((long)pvVar1 + 0x1cb0));
        *(undefined8 *)((long)pvVar1 + 0x1cb0) = 0;
      }
      return local_1bc;
    }
    iVar2 = __isoc99_sscanf(beg->data,"%127[^= ]%*[ =]%255s",option_arg + 0xf8,&data);
    if (iVar2 != 2) {
      Curl_failf(data_00,"Syntax error in telnet option: %s",beg->data);
      local_1bc = CURLE_TELNET_OPTION_SYNTAX;
      goto LAB_0013e5dd;
    }
    iVar2 = Curl_raw_equal(option_arg + 0xf8,"TTYPE");
    if (iVar2 == 0) {
      iVar2 = Curl_raw_equal(option_arg + 0xf8,"XDISPLOC");
      if (iVar2 == 0) {
        iVar2 = Curl_raw_equal(option_arg + 0xf8,"NEW_ENV");
        if (iVar2 == 0) {
          iVar2 = Curl_raw_equal(option_arg + 0xf8,"WS");
          if (iVar2 == 0) {
            iVar2 = Curl_raw_equal(option_arg + 0xf8,"BINARY");
            if (iVar2 == 0) {
              Curl_failf(data_00,"Unknown telnet option %s",beg->data);
              local_1bc = CURLE_UNKNOWN_OPTION;
              goto LAB_0013e5dd;
            }
            iVar2 = atoi((char *)&data);
            if (iVar2 != 1) {
              *(undefined4 *)((long)pvVar1 + 0x808) = 0;
              *(undefined4 *)((long)pvVar1 + 0x1408) = 0;
            }
          }
          else {
            iVar2 = __isoc99_sscanf(&data,"%hu%*[xX]%hu",(long)pvVar1 + 0x1ca8,(long)pvVar1 + 0x1caa
                                   );
            if (iVar2 != 2) {
              Curl_failf(data_00,"Syntax error in telnet option: %s",beg->data);
              local_1bc = CURLE_TELNET_OPTION_SYNTAX;
              goto LAB_0013e5dd;
            }
            *(undefined4 *)((long)pvVar1 + 0x884) = 1;
          }
        }
        else {
          pcVar3 = curl_slist_append(*(curl_slist **)((long)pvVar1 + 0x1cb0),(char *)&data);
          if (pcVar3 == (curl_slist *)0x0) {
            local_1bc = CURLE_OUT_OF_MEMORY;
            goto LAB_0013e5dd;
          }
          *(curl_slist **)((long)pvVar1 + 0x1cb0) = pcVar3;
          *(undefined4 *)((long)pvVar1 + 0x8a4) = 1;
        }
      }
      else {
        strncpy((char *)((long)pvVar1 + 0x1c28),(char *)&data,0x7f);
        *(undefined1 *)((long)pvVar1 + 0x1ca7) = 0;
        *(undefined4 *)((long)pvVar1 + 0x894) = 1;
      }
    }
    else {
      strncpy((char *)((long)pvVar1 + 0x1c08),(char *)&data,0x1f);
      *(undefined1 *)((long)pvVar1 + 0x1c27) = 0;
      *(undefined4 *)((long)pvVar1 + 0x868) = 1;
    }
    beg = beg->next;
  } while( true );
}

Assistant:

static CURLcode check_telnet_options(struct connectdata *conn)
{
  struct curl_slist *head;
  struct curl_slist *beg;
  char option_keyword[128] = "";
  char option_arg[256] = "";
  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)conn->data->req.protop;
  CURLcode result = CURLE_OK;
  int binary_option;

  /* Add the user name as an environment variable if it
     was given on the command line */
  if(conn->bits.user_passwd) {
    snprintf(option_arg, sizeof(option_arg), "USER,%s", conn->user);
    beg = curl_slist_append(tn->telnet_vars, option_arg);
    if(!beg) {
      curl_slist_free_all(tn->telnet_vars);
      tn->telnet_vars = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
    tn->telnet_vars = beg;
    tn->us_preferred[CURL_TELOPT_NEW_ENVIRON] = CURL_YES;
  }

  for(head = data->set.telnet_options; head; head=head->next) {
    if(sscanf(head->data, "%127[^= ]%*[ =]%255s",
              option_keyword, option_arg) == 2) {

      /* Terminal type */
      if(Curl_raw_equal(option_keyword, "TTYPE")) {
        strncpy(tn->subopt_ttype, option_arg, 31);
        tn->subopt_ttype[31] = 0; /* String termination */
        tn->us_preferred[CURL_TELOPT_TTYPE] = CURL_YES;
        continue;
      }

      /* Display variable */
      if(Curl_raw_equal(option_keyword, "XDISPLOC")) {
        strncpy(tn->subopt_xdisploc, option_arg, 127);
        tn->subopt_xdisploc[127] = 0; /* String termination */
        tn->us_preferred[CURL_TELOPT_XDISPLOC] = CURL_YES;
        continue;
      }

      /* Environment variable */
      if(Curl_raw_equal(option_keyword, "NEW_ENV")) {
        beg = curl_slist_append(tn->telnet_vars, option_arg);
        if(!beg) {
          result = CURLE_OUT_OF_MEMORY;
          break;
        }
        tn->telnet_vars = beg;
        tn->us_preferred[CURL_TELOPT_NEW_ENVIRON] = CURL_YES;
        continue;
      }

          /* Window Size */
      if(Curl_raw_equal(option_keyword, "WS")) {
        if(sscanf(option_arg, "%hu%*[xX]%hu",
                  &tn->subopt_wsx, &tn->subopt_wsy) == 2)
          tn->us_preferred[CURL_TELOPT_NAWS] = CURL_YES;
        else {
          failf(data, "Syntax error in telnet option: %s", head->data);
          result = CURLE_TELNET_OPTION_SYNTAX;
          break;
        }
        continue;
      }

      /* To take care or not of the 8th bit in data exchange */
      if(Curl_raw_equal(option_keyword, "BINARY")) {
        binary_option=atoi(option_arg);
        if(binary_option!=1) {
          tn->us_preferred[CURL_TELOPT_BINARY] = CURL_NO;
          tn->him_preferred[CURL_TELOPT_BINARY] = CURL_NO;
        }
        continue;
      }

      failf(data, "Unknown telnet option %s", head->data);
      result = CURLE_UNKNOWN_TELNET_OPTION;
      break;
    }
    else {
      failf(data, "Syntax error in telnet option: %s", head->data);
      result = CURLE_TELNET_OPTION_SYNTAX;
      break;
    }
  }

  if(result) {
    curl_slist_free_all(tn->telnet_vars);
    tn->telnet_vars = NULL;
  }

  return result;
}